

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::ensure_param(float *v,float lo,float hi,float def,char *string)

{
  ostream *this;
  char *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  
  if ((*in_RDI < in_XMM0_Da) || (in_XMM1_Da < *in_RDI)) {
    this = std::operator<<((ostream *)&std::cerr,in_RSI);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    *in_RDI = in_XMM2_Da;
  }
  return;
}

Assistant:

void ensure_param(float& v, float lo, float hi, float def, const char* string)
{
  if ((v < lo) || (v > hi))
  {
    std::cerr << string << endl;
    v = def;
  }
}